

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialDistribution.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<5>::PartialDistribution::PartialDistribution
          (PartialDistribution *this,PartialDistribution *param_1)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  uVar1 = *(undefined8 *)
           &(param_1->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>;
  lVar2 = ((_Head_base<4UL,_long,_false> *)
          ((long)&(param_1->probability_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl;
  lVar3 = ((_Head_base<3UL,_long,_false> *)
          ((long)&(param_1->probability_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl;
  lVar4 = ((_Head_base<2UL,_long,_false> *)
          ((long)&(param_1->probability_).super_TabulationRecord.super_InterpolationBase.metadata.
                  fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                  super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl;
  dVar5 = (param_1->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Head_base<0UL,_double,_false>._M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       ((_Head_base<1UL,_double,_false> *)
       ((long)&(param_1->probability_).super_TabulationRecord.super_InterpolationBase.metadata.
               fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl;
  (this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = dVar5;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl = lVar3;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl = lVar4;
  *(undefined8 *)
   &(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> = uVar1;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl = lVar2;
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices,
             &(param_1->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices
            );
  std::vector<long,_std::allocator<long>_>::vector
            (&(this->probability_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices,
             &(param_1->probability_).super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->probability_).super_TabulationRecord.xValues,
             &(param_1->probability_).super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&(this->probability_).super_TabulationRecord.yValues,
             &(param_1->probability_).super_TabulationRecord.yValues);
  std::__detail::__variant::
  _Copy_ctor_base<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                     *)&this->distribution_,
                    (_Copy_ctor_base<false,_njoy::ENDFtk::section::Type<5>::TabulatedSpectrum,_njoy::ENDFtk::section::Type<5>::GeneralEvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::MaxwellianFissionSpectrum,_njoy::ENDFtk::section::Type<5>::EvaporationSpectrum,_njoy::ENDFtk::section::Type<5>::WattSpectrum,_njoy::ENDFtk::section::Type<5>::MadlandNixSpectrum>
                     *)&param_1->distribution_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT PartialDistribution {

  Probability probability_;
  Distribution distribution_;

  /* auxiliary functions */
  #include "ENDFtk/section/5/PartialDistribution/src/verifyLF.hpp"
  #include "ENDFtk/section/5/PartialDistribution/src/readPartialDistribution.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/5/PartialDistribution/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the constant that defines the upper energy
   *         limit E - U for the secondary particle's energy E'
   */
  double U() const { return this->probability_.U(); }

  /**
   *  @brief Return the constant that defines the upper energy
   *         limit E - U for the secondary particle's energy E'
   */
  double energyLimitConstant() const { return this->U(); }

  /**
   *  @brief Return the probability
   */
  const Probability& probability() const { return this->probability_; }

  /**
   *  @brief Return the distribution
   */
  const Distribution& distribution() const { return this->distribution_; }

  #include "ENDFtk/section/5/PartialDistribution/src/NC.hpp"
  #include "ENDFtk/section/5/PartialDistribution/src/print.hpp"
}